

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  ImGuiTable *pIVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = (ctx->Tables).Buf.Size;
  if ((ulong)uVar1 != 0) {
    lVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    do {
      if (uVar4 * 0x250 - lVar3 == 0) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                      ,0x658,"T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]");
      }
      pIVar2 = (ctx->Tables).Buf.Data;
      (&pIVar2->IsSettingsRequestLoad)[lVar3] = true;
      *(undefined4 *)((long)pIVar2->RowBgColor + lVar3 + -0x34) = 0xffffffff;
      lVar3 = lVar3 + 0x250;
    } while ((ulong)uVar1 * 0x250 - lVar3 != 0);
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
    {
        ImGuiTable* table = g.Tables.GetByIndex(i);
        table->IsSettingsRequestLoad = true;
        table->SettingsOffset = -1;
    }
}